

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O3

IPV6 * Network::Address::IPV6::queryNameServer
                 (IPV6 *__return_storage_ptr__,String *host,TimeOut *timeout)

{
  undefined8 uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  sockaddr *psVar5;
  String port;
  addrinfo *res;
  String SStack_78;
  addrinfo *local_68;
  String local_60;
  undefined1 local_50 [24];
  undefined1 local_38 [16];
  addrinfo *local_28;
  
  if ((timeout->remainingTime < 1) || (timeout->remainingTime != 3000)) {
LAB_0010c574:
    (__return_storage_ptr__->super_BaseAddress)._vptr_BaseAddress =
         (_func_int **)&PTR_asText_0012e498;
    *(undefined1 (*) [16])&__return_storage_ptr__->address = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(__return_storage_ptr__->address).sin6_addr.__in6_u + 4) =
         (undefined1  [16])0x0;
    (__return_storage_ptr__->address).sin6_family = 10;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[0] = 0xffffffff;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[1] = 0xffffffff;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[2] = 0xffffffff;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[3] = 0xffffffff;
  }
  else {
    local_38 = (undefined1  [16])0x0;
    local_50._8_16_ = (undefined1  [16])0x0;
    local_28 = (addrinfo *)0x0;
    local_68 = (addrinfo *)0x0;
    local_50._0_8_ = 0xa00000004;
    Bstrlib::String::String(&local_60,"]");
    Bstrlib::String::upToFirst(&SStack_78,host,SUB81(&local_60,0));
    iVar3 = getaddrinfo((char *)SStack_78.super_tagbstring.data,(char *)0x0,(addrinfo *)local_50,
                        &local_68);
    Bstrlib::String::~String(&SStack_78);
    Bstrlib::String::~String(&local_60);
    if (iVar3 != 0) {
      local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
      Bstrlib::String::String(&local_60,"]");
      Bstrlib::String::upToFirst(&SStack_78,host,SUB81(&local_60,0));
      iVar3 = getaddrinfo((char *)SStack_78.super_tagbstring.data,(char *)0x0,(addrinfo *)local_50,
                          &local_68);
      Bstrlib::String::~String(&SStack_78);
      Bstrlib::String::~String(&local_60);
      if (iVar3 != 0) goto LAB_0010c574;
    }
    Bstrlib::String::String(&local_60,"]");
    Bstrlib::String::fromFirst(&SStack_78,host,SUB81(&local_60,0));
    Bstrlib::String::~String(&local_60);
    psVar5 = local_68->ai_addr;
    uVar2 = *(ushort *)psVar5->sa_data;
    if (((local_68->ai_family == 10) && (uVar2 == 0)) && (SStack_78.super_tagbstring.slen != 0)) {
      uVar4 = Bstrlib::String::operator_cast_to_unsigned_int(&SStack_78);
      uVar2 = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
      psVar5 = local_68->ai_addr;
      *(ushort *)psVar5->sa_data = uVar2;
    }
    (__return_storage_ptr__->super_BaseAddress)._vptr_BaseAddress =
         (_func_int **)&PTR_asText_0012e498;
    *(undefined1 (*) [16])&__return_storage_ptr__->address = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(__return_storage_ptr__->address).sin6_addr.__in6_u + 4) =
         (undefined1  [16])0x0;
    uVar1 = *(undefined8 *)(psVar5 + 1);
    *(undefined8 *)&(__return_storage_ptr__->address).sin6_addr.__in6_u =
         *(undefined8 *)(psVar5->sa_data + 6);
    *(undefined8 *)((long)&(__return_storage_ptr__->address).sin6_addr.__in6_u + 8) = uVar1;
    (__return_storage_ptr__->address).sin6_family = 10;
    (__return_storage_ptr__->address).sin6_port = uVar2;
    freeaddrinfo(local_68);
    Bstrlib::String::~String(&SStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

IPV6 IPV6::queryNameServer(const String & host, const Time::TimeOut & timeout)
        {
            if (timeout <= 0) return IPV6();
#ifndef NEXIO
            if (timeout == DefaultTimeOut)
            {
                struct addrinfo hints = {0}, *res = 0;
                hints.ai_family = AF_INET6;
                hints.ai_flags = AI_NUMERICHOST;

                // First try without resolving the domain name
                if (getaddrinfo((const char*)host.upToFirst("]", true), NULL, &hints, &res) != 0)
                {
                    // Ok, then resolve
                    hints.ai_flags = 0;
                    if (getaddrinfo((const char*)host.upToFirst("]", true), NULL, &hints, &res) != 0)
                        return IPV6();
                }
                String port = host.fromFirst("]");
                if (res[0].ai_family == AF_INET6 && !((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port && port.getLength())
                    ((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port = htons((unsigned int)port);


                IPV6 result((const uint8*)((struct sockaddr_in6 *)res[0].ai_addr)->sin6_addr.s6_addr, (uint16)ntohs(((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port));
                freeaddrinfo(res);
                return result;
            }
#endif
            // Not implemented yet with a timeout
            return IPV6();
        }